

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmscreen.cpp
# Opt level: O3

void __thiscall QEglFSKmsGbmScreen::updateFlipStatus(QEglFSKmsGbmScreen *this)

{
  long lVar1;
  long lVar2;
  
  if (this->m_cloneSource != (QEglFSKmsGbmScreen *)0x0) {
    return;
  }
  if (this->m_flipPending == false) {
    lVar1 = (this->m_cloneDests).d.size;
    if (lVar1 != 0) {
      lVar2 = 0;
      do {
        if ((&((this->m_cloneDests).d.ptr)->cloneFlipPending)[lVar2] != false) {
          return;
        }
        lVar2 = lVar2 + 0x10;
      } while (lVar1 << 4 != lVar2);
    }
    if (this->m_gbm_bo_current != (gbm_bo *)0x0) {
      gbm_surface_release_buffer(this->m_gbm_surface);
    }
    this->m_gbm_bo_current = this->m_gbm_bo_next;
    this->m_gbm_bo_next = (gbm_bo *)0x0;
  }
  return;
}

Assistant:

void QEglFSKmsGbmScreen::updateFlipStatus()
{
    // only for 'real' outputs that own the color buffer, i.e. that are not cloning another one
    if (m_cloneSource)
        return;

    // proceed only if flips for both this and all others that clone this have finished
    if (m_flipPending)
        return;

    for (const CloneDestination &d : std::as_const(m_cloneDests)) {
        if (d.cloneFlipPending)
            return;
    }

    if (m_gbm_bo_current) {
        gbm_surface_release_buffer(m_gbm_surface,
                                   m_gbm_bo_current);
    }

    m_gbm_bo_current = m_gbm_bo_next;
    m_gbm_bo_next = nullptr;
}